

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionVariable.cpp
# Opt level: O3

bool __thiscall InductionVariable::Add(InductionVariable *this,int n)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  IntConstantBounds local_30;
  int32 local_28;
  int32 local_24;
  int newLowerBound;
  int newUpperBound;
  
  bVar4 = IsChangeDeterminate(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InductionVariable.cpp"
                       ,0x4f,"(IsChangeDeterminate())","IsChangeDeterminate()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (n == 0) {
LAB_0053d546:
    bVar4 = true;
  }
  else {
    iVar1 = (this->changeBounds).lowerBound;
    iVar2 = (this->changeBounds).upperBound;
    if (n < 0) {
      if (iVar2 <= iVar1) {
        bVar4 = iVar1 < 1;
        goto LAB_0053d478;
      }
    }
    else if (iVar1 <= iVar2) {
      bVar4 = -1 < iVar1;
LAB_0053d478:
      if (bVar4 || iVar1 != iVar2) {
        if (iVar1 == 0x7fffffff) {
          if (n < 0) goto LAB_0053d47c;
          local_28 = 0x7fffffff;
        }
        else {
          bVar4 = Int32Math::Add(iVar1,n,&local_28);
          if (bVar4) {
            local_28 = 0x7fffffff - (n >> 0x1f);
          }
        }
        iVar1 = (this->changeBounds).upperBound;
        if (iVar1 == 0x7fffffff) {
          if (n < 0) goto LAB_0053d47c;
          local_24 = 0x7fffffff;
        }
        else {
          bVar4 = Int32Math::Add(iVar1,n,&local_24);
          if (bVar4) {
            local_24 = 0x7fffffff - (n >> 0x1f);
          }
        }
        IntConstantBounds::IntConstantBounds(&local_30,local_28,local_24);
        this->changeBounds = local_30;
        goto LAB_0053d546;
      }
    }
LAB_0053d47c:
    this->isChangeDeterminate = false;
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool InductionVariable::Add(const int n)
{
    Assert(IsChangeDeterminate());

    if(n == 0)
        return true;

    int lowerBound = changeBounds.LowerBound();
    int upperBound = changeBounds.UpperBound();

    if (n < 0 && (lowerBound < upperBound || (lowerBound == upperBound && lowerBound > 0)))
    {
        isChangeDeterminate = false;
        return false;
    }

    if (n > 0 && (lowerBound > upperBound || (lowerBound == upperBound && lowerBound < 0)))
    {
        isChangeDeterminate = false;
        return false;
    }

    int newLowerBound;
    if(changeBounds.LowerBound() == IntConstMin)
    {
        if(n >= 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newLowerBound = IntConstMin;
    }
    else if(changeBounds.LowerBound() == IntConstMax)
    {
        if(n < 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newLowerBound = IntConstMax;
    }
    else if(Int32Math::Add(changeBounds.LowerBound(), n, &newLowerBound))
        newLowerBound = n < 0 ? IntConstMin : IntConstMax;

    int newUpperBound;
    if(changeBounds.UpperBound() == IntConstMin)
    {
        if(n >= 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newUpperBound = IntConstMin;
    }
    else if(changeBounds.UpperBound() == IntConstMax)
    {
        if(n < 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newUpperBound = IntConstMax;
    }
    else if(Int32Math::Add(changeBounds.UpperBound(), n, &newUpperBound))
        newUpperBound = n < 0 ? IntConstMin : IntConstMax;

    changeBounds = IntConstantBounds(newLowerBound, newUpperBound);
    return true;
}